

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O0

double MaxNorm_V(Vector *V)

{
  LASErrIdType LVar1;
  Real *VCmp;
  size_t Ind;
  size_t Dim;
  double Cmp;
  double MaxCmp;
  double SRes;
  Vector *V_local;
  
  V_Lock(V);
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    Cmp = 0.0;
    for (VCmp = (Real *)0x1; VCmp <= (Real *)V->Dim; VCmp = (Real *)((long)VCmp + 1)) {
      if (Cmp < ABS(V->Cmp[(long)VCmp])) {
        Cmp = ABS(V->Cmp[(long)VCmp]);
      }
    }
    MaxCmp = V->Multipl * Cmp;
  }
  else {
    MaxCmp = 1.0;
  }
  V_Unlock(V);
  return MaxCmp;
}

Assistant:

double MaxNorm_V(Vector *V)
/* SRes = max-Norm of the vector V */
{
    double SRes;

    double MaxCmp, Cmp;
    size_t Dim, Ind;
    Real *VCmp;

    V_Lock(V);
    
    if (LASResult() == LASOK) {
        Dim = V->Dim;
        VCmp = V->Cmp;
        MaxCmp = 0.0;
        for_AllCmp {
           Cmp = fabs(VCmp[Ind]);
           if (Cmp > MaxCmp) 
               MaxCmp = Cmp;
        }
        MaxCmp *= V->Multipl;
        SRes = MaxCmp;
    } else {
        SRes = 1.0;
    }

    V_Unlock(V);

    return(SRes);
}